

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

int xmlParse3986Authority(xmlURIPtr uri,char **str)

{
  xmlChar *pxVar1;
  byte *pbVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  byte bVar6;
  char *cur;
  byte *cur_00;
  bool bVar7;
  byte *local_30;
  
  cur_00 = (byte *)*str;
  pbVar2 = cur_00;
LAB_0018c758:
  bVar6 = *pbVar2;
  if ((9 < (byte)(bVar6 - 0x30)) && (0x19 < (byte)((bVar6 & 0xdf) + 0xbf))) {
    uVar4 = (ulong)(bVar6 - 0x21);
    if (bVar6 - 0x21 < 0x3f) {
      if ((0x4000000016003fe9U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 4) {
          if (uVar4 != 0x1f) goto LAB_0018c7dd;
          if (uri != (xmlURIPtr)0x0) {
            if (uri->user != (char *)0x0) {
              (*xmlFree)(uri->user);
            }
            iVar5 = (int)pbVar2 - (int)cur_00;
            if ((uri->cleanup & 2) == 0) {
              pxVar1 = (xmlChar *)xmlURIUnescapeString((char *)cur_00,iVar5,(char *)0x0);
            }
            else {
              pxVar1 = xmlStrndup(cur_00,iVar5);
            }
            uri->user = (char *)pxVar1;
            if (*pbVar2 != 0x40) {
              cur_00 = (byte *)*str;
              goto LAB_0018c832;
            }
          }
          cur_00 = pbVar2 + 1;
LAB_0018c832:
          bVar6 = *cur_00;
          if (bVar6 == 0x5b) {
            local_30 = cur_00 + 1;
            do {
              bVar6 = *local_30;
              if (bVar6 == 0) {
                return 1;
              }
              local_30 = local_30 + 1;
            } while (bVar6 != 0x5d);
LAB_0018c960:
            if (uri != (xmlURIPtr)0x0) {
              if (uri->authority != (char *)0x0) {
                (*xmlFree)(uri->authority);
              }
              uri->authority = (char *)0x0;
              if (uri->server != (char *)0x0) {
                (*xmlFree)(uri->server);
              }
              pbVar2 = local_30;
              if (local_30 == cur_00) {
                uri->server = (char *)0x0;
                local_30 = pbVar2;
              }
              else {
                iVar5 = (int)local_30 - (int)cur_00;
                if ((uri->cleanup & 2) == 0) {
                  pxVar1 = (xmlChar *)xmlURIUnescapeString((char *)cur_00,iVar5,(char *)0x0);
                }
                else {
                  pxVar1 = xmlStrndup(cur_00,iVar5);
                }
                uri->server = (char *)pxVar1;
                local_30 = pbVar2;
              }
            }
            if (*local_30 == 0x3a) {
              bVar6 = local_30[1];
              if (9 < (byte)(bVar6 - 0x30)) {
                return 1;
              }
              local_30 = local_30 + 1;
              iVar5 = 0;
              do {
                if (0xccccccc < iVar5) {
                  return 1;
                }
                if ((int)((byte)(bVar6 - 0x30) ^ 0x7fffffff) < iVar5 * 10) {
                  return 1;
                }
                iVar5 = iVar5 * 10 + (uint)(byte)(bVar6 - 0x30);
                bVar6 = local_30[1];
                local_30 = local_30 + 1;
              } while ((byte)(bVar6 - 0x30) < 10);
              if (uri != (xmlURIPtr)0x0) {
                uri->port = iVar5;
              }
            }
            *str = (char *)local_30;
            return 0;
          }
          pbVar2 = cur_00;
          if ((((byte)(bVar6 - 0x30) < 10) &&
              (local_30 = cur_00, iVar5 = xmlParse3986DecOctet((char **)&local_30), iVar5 == 0)) &&
             (*local_30 == 0x2e)) {
            local_30 = local_30 + 1;
            iVar5 = xmlParse3986DecOctet((char **)&local_30);
            if (((iVar5 == 0) && (*local_30 == 0x2e)) &&
               ((iVar5 = xmlParse3986DecOctet((char **)&local_30), iVar5 == 0 &&
                ((*local_30 == 0x2e &&
                 (iVar5 = xmlParse3986DecOctet((char **)&local_30), iVar5 == 0))))))
            goto LAB_0018c960;
          }
          do {
            if ((9 < (byte)(bVar6 - 0x30)) && (0x19 < (byte)((bVar6 & 0xdf) + 0xbf))) {
              uVar3 = bVar6 - 0x21;
              local_30 = pbVar2;
              if (uVar3 < 0x3f) {
                if ((0x4000000014003fe9U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
                  if ((ulong)uVar3 != 4) goto LAB_0018c956;
                  if (((9 < (byte)(pbVar2[1] - 0x30)) &&
                      ((uVar3 = pbVar2[1] - 0x41, 0x25 < uVar3 ||
                       ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0)))) ||
                     ((9 < (byte)(pbVar2[2] - 0x30) &&
                      ((uVar3 = pbVar2[2] - 0x41, 0x25 < uVar3 ||
                       ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0)))))) goto LAB_0018c960;
                }
              }
              else {
LAB_0018c956:
                if (bVar6 != 0x7e) goto LAB_0018c960;
              }
            }
            bVar7 = bVar6 == 0x25;
            bVar6 = pbVar2[(ulong)bVar7 * 2 + 1];
            pbVar2 = pbVar2 + (ulong)bVar7 * 2 + 1;
          } while( true );
        }
        if (((9 < (byte)(pbVar2[1] - 0x30)) &&
            ((uVar3 = pbVar2[1] - 0x41, 0x25 < uVar3 ||
             ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0)))) ||
           ((9 < (byte)(pbVar2[2] - 0x30) &&
            ((uVar3 = pbVar2[2] - 0x41, 0x25 < uVar3 ||
             ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0)))))) goto LAB_0018c832;
      }
    }
    else {
LAB_0018c7dd:
      if (bVar6 != 0x7e) goto LAB_0018c832;
    }
  }
  pbVar2 = pbVar2 + (ulong)(bVar6 == 0x25) * 2 + 1;
  goto LAB_0018c758;
}

Assistant:

static int
xmlParse3986Authority(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;
    /*
     * try to parse an userinfo and check for the trailing @
     */
    ret = xmlParse3986Userinfo(uri, &cur);
    if ((ret != 0) || (*cur != '@'))
        cur = *str;
    else
        cur++;
    ret = xmlParse3986Host(uri, &cur);
    if (ret != 0) return(ret);
    if (*cur == ':') {
        cur++;
        ret = xmlParse3986Port(uri, &cur);
	if (ret != 0) return(ret);
    }
    *str = cur;
    return(0);
}